

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O1

fio_str_info_s *
fio_str_vprintf(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,char *format,
               __va_list_tag *argv)

{
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  size_t sVar6;
  va_list argv_cpy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = argv->reg_save_area;
  local_48._0_4_ = argv->gp_offset;
  local_48._4_4_ = argv->fp_offset;
  pvStack_40 = argv->overflow_arg_area;
  uVar3 = vsnprintf((char *)0x0,0,format,&local_48);
  if ((int)uVar3 < 1) {
    if (s == (fio_str_s_conflict *)0x0) {
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = 0;
      __return_storage_ptr__->data = (char *)0x0;
    }
    else {
      bVar1 = s->small;
      if ((bVar1 == 0) && (pcVar2 = s->data, pcVar2 != (char *)0x0)) {
        if (s->frozen == '\0') {
          uVar4 = s->capa;
        }
        else {
          uVar4 = 0;
        }
        __return_storage_ptr__->capa = uVar4;
        __return_storage_ptr__->len = s->len;
        __return_storage_ptr__->data = pcVar2;
      }
      else {
        sVar6 = 0x2d;
        if (s->frozen != '\0') {
          sVar6 = 0;
        }
        __return_storage_ptr__->capa = sVar6;
        __return_storage_ptr__->len = (ulong)(bVar1 >> 1);
        __return_storage_ptr__->data = (char *)s->reserved;
      }
    }
  }
  else {
    if ((s->small == 0) && (s->data != (char *)0x0)) {
      uVar5 = s->len;
    }
    else {
      uVar5 = (ulong)(s->small >> 1);
    }
    fio_str_resize(__return_storage_ptr__,s,uVar5 + uVar3);
    vsnprintf(__return_storage_ptr__->data + (__return_storage_ptr__->len - (ulong)uVar3),
              (ulong)(uVar3 + 1),format,argv);
  }
  return __return_storage_ptr__;
}

Assistant:

FIO_FUNC __attribute__((format(printf, 2, 0))) fio_str_info_s
fio_str_vprintf(fio_str_s *s, const char *format, va_list argv) {
  va_list argv_cpy;
  va_copy(argv_cpy, argv);
  int len = vsnprintf(NULL, 0, format, argv_cpy);
  va_end(argv_cpy);
  if (len <= 0)
    return fio_str_info(s);
  fio_str_info_s state = fio_str_resize(s, len + fio_str_len(s));
  vsnprintf(state.data + (state.len - len), len + 1, format, argv);
  return state;
}